

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

MtrNode * Cudd_MakeTreeNode(DdManager *dd,uint low,uint size,uint type)

{
  MtrNode *pMVar1;
  uint uVar2;
  uint low_00;
  
  low_00 = low;
  if (low < (uint)dd->size) {
    low_00 = dd->perm[low];
  }
  uVar2 = low_00 + size;
  if (-1 < (int)(uVar2 - 1)) {
    pMVar1 = dd->tree;
    if (pMVar1 == (MtrNode *)0x0) {
      pMVar1 = Mtr_InitGroupTree(0,dd->size);
      dd->tree = pMVar1;
      if (pMVar1 == (MtrNode *)0x0) {
        return (MtrNode *)0x0;
      }
      pMVar1->index = *dd->invperm;
    }
    if (uVar2 < (uint)dd->size) {
      uVar2 = dd->size;
    }
    if (uVar2 <= pMVar1->size) {
      uVar2 = pMVar1->size;
    }
    pMVar1->size = uVar2;
    pMVar1 = Mtr_MakeGroup(pMVar1,low_00,size,type);
    if (pMVar1 != (MtrNode *)0x0) {
      pMVar1->index = low;
      return pMVar1;
    }
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Cudd_MakeTreeNode(
  DdManager * dd /* manager */,
  unsigned int  low /* index of the first group variable */,
  unsigned int  size /* number of variables in the group */,
  unsigned int  type /* MTR_DEFAULT or MTR_FIXED */)
{
    MtrNode *group;
    MtrNode *tree;
    unsigned int level;

    /* If the variable does not exist yet, the position is assumed to be
    ** the same as the index. Therefore, applications that rely on
    ** Cudd_bddNewVarAtLevel or Cudd_addNewVarAtLevel to create new
    ** variables have to create the variables before they group them.
    */
    level = (low < (unsigned int) dd->size) ? dd->perm[low] : low;

    if (level + size - 1> (int) MTR_MAXHIGH)
        return(NULL);

    /* If the tree does not exist yet, create it. */
    tree = dd->tree;
    if (tree == NULL) {
        dd->tree = tree = Mtr_InitGroupTree(0, dd->size);
        if (tree == NULL)
            return(NULL);
        tree->index = dd->invperm[0];
    }

    /* Extend the upper bound of the tree if necessary. This allows the
    ** application to create groups even before the variables are created.
    */
    tree->size = ddMax(tree->size, ddMax(level + size, (unsigned) dd->size));

    /* Create the group. */
    group = Mtr_MakeGroup(tree, level, size, type);
    if (group == NULL)
        return(NULL);

    /* Initialize the index field to the index of the variable currently
    ** in position low. This field will be updated by the reordering
    ** procedure to provide a handle to the group once it has been moved.
    */
    group->index = (MtrHalfWord) low;

    return(group);

}